

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void fmt::v5::internal::
     parse_format_string<false,char,fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>&>
               (basic_string_view<char> format_str,
               format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
               *handler)

{
  internal *end;
  ulong uVar1;
  basic_buffer<char> *pbVar2;
  size_t sVar3;
  internal *piVar4;
  internal *piVar5;
  undefined1 uVar6;
  undefined7 in_register_00000009;
  char *pcVar7;
  internal *end_00;
  size_t __n;
  basic_buffer<char> *c;
  internal *begin;
  null_terminating_iterator<char> nVar8;
  iterator iVar9;
  format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  *local_40;
  internal *local_38;
  
  __n = format_str.size_;
  begin = (internal *)format_str.data_;
  end_00 = begin + __n;
  piVar4 = (internal *)memchr(begin,0x7b,__n);
  piVar5 = end_00;
  if (piVar4 != end_00 && piVar4 != (internal *)0x0) {
    do {
      local_38 = piVar5;
      piVar5 = (internal *)memchr(begin,0x7d,(long)piVar4 - (long)begin);
      uVar6 = piVar5 == piVar4 || piVar5 == (internal *)0x0;
      if (piVar5 != piVar4 && piVar5 != (internal *)0x0) {
        do {
          end = piVar5 + 1;
          if ((end == piVar4) || (*end != (internal)0x7d)) {
            error_handler::on_error((error_handler *)handler,"unmatched \'}\' in format string");
          }
          format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          ::on_text(handler,(char *)begin,(char *)end);
          begin = piVar5 + 2;
          piVar5 = (internal *)memchr(begin,0x7d,(long)piVar4 - (long)begin);
        } while ((piVar5 != (internal *)0x0) && (piVar5 != piVar4));
      }
      format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
      ::on_text(handler,(char *)begin,(char *)piVar4);
      piVar5 = piVar4 + 1;
      if ((piVar5 == end_00) || (*piVar5 != (internal)0x7b)) {
        nVar8.end_ = (char *)&local_40;
        nVar8.ptr_ = (char *)end_00;
        local_40 = handler;
        nVar8 = parse_arg_id<fmt::v5::internal::null_terminating_iterator<char>,fmt::v5::internal::id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>&,char>>
                          (piVar5,nVar8,
                           (id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_&,_char>
                            *)CONCAT71(in_register_00000009,uVar6));
        iVar9.end_ = nVar8.end_;
        pcVar7 = nVar8.ptr_;
        if (pcVar7 == iVar9.end_) {
LAB_0011eb99:
          pcVar7 = "missing \'}\' in format string";
          goto LAB_0011eba9;
        }
        if (*pcVar7 == ':') {
          iVar9.ptr_ = pcVar7 + 1;
          iVar9 = format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                  ::on_format_specs(handler,iVar9);
          pcVar7 = iVar9.ptr_;
          if ((pcVar7 == iVar9.end_) || (*pcVar7 != '}')) {
            pcVar7 = "unknown format specifier";
            goto LAB_0011eba9;
          }
        }
        else {
          if (*pcVar7 != '}') goto LAB_0011eb99;
          format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          ::on_replacement_field(handler,nVar8);
        }
        begin = (internal *)(pcVar7 + 1);
      }
      else {
        pbVar2 = (handler->context).
                 super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
                 .out_.container;
        sVar3 = pbVar2->size_;
        uVar1 = sVar3 + 1;
        if (pbVar2->capacity_ < uVar1) {
          (**pbVar2->_vptr_basic_buffer)(pbVar2,uVar1);
        }
        begin = piVar4 + 2;
        pbVar2->size_ = uVar1;
        *(internal *)(pbVar2->ptr_ + sVar3) = *piVar5;
        (handler->context).
        super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_char>
        .out_.container = pbVar2;
        end_00 = local_38;
      }
      __n = (long)end_00 - (long)begin;
      piVar4 = (internal *)memchr(begin,0x7b,__n);
    } while ((piVar4 != (internal *)0x0) && (piVar5 = local_38, piVar4 != end_00));
  }
  piVar5 = (internal *)memchr(begin,0x7d,__n);
  if (piVar5 != end_00 && piVar5 != (internal *)0x0) {
    do {
      piVar4 = piVar5 + 1;
      if ((piVar4 == end_00) || (*piVar4 != (internal)0x7d)) {
        pcVar7 = "unmatched \'}\' in format string";
LAB_0011eba9:
        error_handler::on_error((error_handler *)handler,pcVar7);
      }
      format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
      ::on_text(handler,(char *)begin,(char *)piVar4);
      begin = piVar5 + 2;
      piVar5 = (internal *)memchr(begin,0x7d,(long)end_00 - (long)begin);
    } while ((piVar5 != (internal *)0x0) && (piVar5 != end_00));
  }
  format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  ::on_text(handler,(char *)begin,(char *)end_00);
  return;
}

Assistant:

FMT_CONSTEXPR void parse_format_string(
        basic_string_view<Char> format_str, Handler &&handler) {
  struct writer {
    FMT_CONSTEXPR void operator()(const Char *begin, const Char *end) {
      for (;;) {
        auto p = find<IS_CONSTEXPR>(begin, end, '}');
        if (p == end) {
          handler_.on_text(begin, end);
          return;
        }
        ++p;
        if (p == end || *p != '}') {
          handler_.on_error("unmatched '}' in format string");
          return;
        }
        handler_.on_text(begin, p);
        begin = p + 1;
      }
    }
    Handler &handler_;
  } write{handler};
  auto begin = format_str.data();
  auto end = begin + format_str.size();
  for (;;) {
    // Doing two passes with memchr (one for '{' and another for '}') is up to
    // 2.5x faster than the naive one-pass implementation on long format strings.
    auto p = find<IS_CONSTEXPR>(begin, end, '{');
    if (p == end) {
      write(begin, end);
      return;
    }
    write(begin, p);
    ++p;
    if (p != end && *p == '{') {
      handler.on_text(p, p + 1);
      begin = p + 1;
      continue;
    }

    internal::null_terminating_iterator<Char> it(p, end);
    it = parse_arg_id(it, id_adapter<Handler, Char>(handler));
    if (*it == '}') {
      handler.on_replacement_field(it);
    } else if (*it == ':') {
      ++it;
      it = handler.on_format_specs(it);
      if (*it != '}') {
        handler.on_error("unknown format specifier");
        return;
      }
    } else {
      handler.on_error("missing '}' in format string");
      return;
    }
    begin = pointer_from(it) + 1;
  }
}